

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O0

QString * __thiscall QUrl::host(QUrl *this,ComponentFormattingOptions options)

{
  bool bVar1;
  undefined4 in_EDX;
  QString *in_RSI;
  QUrlPrivate *in_RDI;
  long in_FS_OFFSET;
  FormattingOptions in_stack_0000000c;
  QString *result;
  QString *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  CaseSensitivity in_stack_ffffffffffffff84;
  undefined4 uVar2;
  QString *this_00;
  QUrlPrivate *pQVar3;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar4;
  QString *appendTo;
  QUrlPrivate *this_01;
  QChar local_16;
  undefined4 local_14;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0;
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->scheme).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->scheme).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = in_RDI;
  appendTo = in_RSI;
  this_01 = in_RDI;
  local_c = in_EDX;
  QString::QString((QString *)0x2fc06b);
  if ((in_RSI->d).d != (Data *)0x0) {
    this_00 = (QString *)(in_RSI->d).d;
    local_14 = local_c;
    QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
              ((QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>)
               SUB84((ulong)this_00 >> 0x20,0));
    QUrlPrivate::appendHost(this_01,appendTo,in_stack_0000000c);
    QChar::QChar<char16_t,_true>(&local_16,L'[');
    bVar1 = QString::startsWith(this_00,(QChar)(char16_t)((ulong)pQVar3 >> 0x30),
                                in_stack_ffffffffffffff84);
    uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff84);
    if (bVar1) {
      QString::size((QString *)in_RDI);
      QString::mid((QString *)this_01,(qsizetype)appendTo,CONCAT17(uVar4,in_stack_ffffffffffffffb8))
      ;
      QString::operator=((QString *)CONCAT44(uVar2,in_stack_ffffffffffffff80),
                         in_stack_ffffffffffffff78);
      QString::~QString((QString *)0x2fc127);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QString QUrl::host(ComponentFormattingOptions options) const
{
    QString result;
    if (d) {
        d->appendHost(result, options);
        if (result.startsWith(u'['))
            result = result.mid(1, result.size() - 2);
    }
    return result;
}